

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ObjCHelper_IsCreateName_Test::
~ObjCHelper_IsCreateName_Test(ObjCHelper_IsCreateName_Test *this)

{
  ObjCHelper_IsCreateName_Test *this_local;
  
  ~ObjCHelper_IsCreateName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, IsCreateName) {
  EXPECT_TRUE(IsCreateName("Create"));
  EXPECT_TRUE(IsCreateName("Copy"));
  EXPECT_TRUE(IsCreateName("CreateFoo"));
  EXPECT_TRUE(IsCreateName("CopyFoo"));
  EXPECT_TRUE(IsCreateName("Create_foo"));
  EXPECT_TRUE(IsCreateName("Copy_foo"));
  EXPECT_TRUE(IsCreateName("ReCreate"));
  EXPECT_TRUE(IsCreateName("ReCopy"));
  EXPECT_TRUE(IsCreateName("FOOCreate"));
  EXPECT_TRUE(IsCreateName("FOOCopy"));
  EXPECT_TRUE(IsCreateName("CreateWithCopy"));

  EXPECT_FALSE(IsCreateName(""));
  EXPECT_FALSE(IsCreateName("Crea"));
  EXPECT_FALSE(IsCreateName("Co"));
  EXPECT_FALSE(IsCreateName("create"));
  EXPECT_FALSE(IsCreateName("recreate"));
  EXPECT_FALSE(IsCreateName("recopy"));
  EXPECT_FALSE(IsCreateName("ReCreated"));
  EXPECT_FALSE(IsCreateName("ReCopying"));

  EXPECT_FALSE(IsCreateName("init"));
  EXPECT_FALSE(IsCreateName("new"));
  EXPECT_FALSE(IsCreateName("alloc"));
  EXPECT_FALSE(IsCreateName("copy"));
  EXPECT_TRUE(IsCreateName("mutableCopy"));
}